

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzintel.cpp
# Opt level: O3

REAL __thiscall TPZInterpolatedElement::MeanSolution(TPZInterpolatedElement *this,int var)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  TPZGeoEl *this_00;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  REAL weight;
  REAL detjac;
  TPZVec<double> intpoint;
  TPZManVector<double,_10> sol;
  double local_2a0;
  undefined1 local_298 [12];
  undefined4 uStack_28c;
  double local_288;
  double dStack_280;
  double local_278;
  TPZVec<double> local_270;
  TPZFMatrix<double> local_250;
  TPZManVector<double,_10> local_1c0;
  TPZFMatrix<double> local_150;
  TPZFMatrix<double> local_c0;
  
  iVar1 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xb0))();
  plVar3 = (long *)(**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xb8
                               ))(this);
  if (plVar3 == (long *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"REAL TPZInterpolatedElement::MeanSolution(int)",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," no material ",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    pcVar4 = "Meansolution no material";
    lVar6 = 0x18;
  }
  else {
    iVar2 = (**(code **)(*plVar3 + 0x88))(plVar3,var);
    if (iVar2 == 1) {
      local_250.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)0x0;
      TPZManVector<double,_10>::TPZManVector(&local_1c0,1,(double *)&local_250);
      local_250.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
      local_250.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
      local_250.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_250.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_250.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_018151d8;
      local_250.fElem = (double *)0x0;
      local_250.fGiven = (double *)0x0;
      local_250.fSize = 0;
      TPZVec<int>::TPZVec(&local_250.fPivot.super_TPZVec<int>,0);
      local_288 = (double)CONCAT44(local_288._4_4_,var);
      local_250.fPivot.super_TPZVec<int>.fStore = local_250.fPivot.fExtAlloc;
      local_250.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_250.fPivot.super_TPZVec<int>.fNElements = 0;
      local_250.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_250.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      local_250.fWork.fStore = (double *)0x0;
      local_250.fWork.fNElements = 0;
      local_250.fWork.fNAlloc = 0;
      local_250.fElem = (double *)operator_new__(0x48);
      local_250.fElem[8] = 0.0;
      local_250.fElem[6] = 0.0;
      local_250.fElem[7] = 0.0;
      local_250.fElem[4] = 0.0;
      local_250.fElem[5] = 0.0;
      local_250.fElem[2] = 0.0;
      local_250.fElem[3] = 0.0;
      *local_250.fElem = 0.0;
      local_250.fElem[1] = 0.0;
      lVar6 = (long)iVar1;
      local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_018151d8;
      local_c0.fElem = (double *)0x0;
      local_c0.fGiven = (double *)0x0;
      local_c0.fSize = 0;
      local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar6;
      local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar6;
      TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
      local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
      local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
      local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      local_c0.fWork.fStore = (double *)0x0;
      local_c0.fWork.fNElements = 0;
      local_c0.fWork.fNAlloc = 0;
      uVar7 = lVar6 * lVar6;
      if (iVar1 != 0) {
        uVar5 = 0xffffffffffffffff;
        if (uVar7 < 0x2000000000000000) {
          uVar5 = uVar7 * 8;
        }
        local_c0.fElem = (double *)operator_new__(uVar5);
      }
      local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_018151d8;
      local_150.fElem = (double *)0x0;
      local_150.fGiven = (double *)0x0;
      local_150.fSize = 0;
      local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar6;
      local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar6;
      TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
      local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
      local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_150.fPivot.super_TPZVec<int>.fNElements = 0;
      local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      local_150.fWork.fStore = (double *)0x0;
      local_150.fWork.fNElements = 0;
      local_150.fWork.fNAlloc = 0;
      if (iVar1 != 0) {
        uVar5 = 0xffffffffffffffff;
        if (uVar7 < 0x2000000000000000) {
          uVar5 = uVar7 * 8;
        }
        local_150.fElem = (double *)operator_new__(uVar5);
      }
      local_2a0 = 0.0;
      TPZVec<double>::TPZVec(&local_270,lVar6,&local_2a0);
      local_2a0 = 0.0;
      this_00 = TPZCompEl::Reference((TPZCompEl *)this);
      _local_298 = ZEXT816(0);
      iVar1 = 0;
      while( true ) {
        plVar3 = (long *)(**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl
                                     + 0x2c8))(this);
        iVar2 = (**(code **)(*plVar3 + 0x18))(plVar3);
        if (iVar2 <= iVar1) break;
        plVar3 = (long *)(**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl
                                     + 0x2c8))(this);
        (**(code **)(*plVar3 + 0x20))(plVar3,iVar1,&local_270,&local_2a0);
        TPZGeoEl::Jacobian(this_00,&local_270,&local_c0,&local_250,&local_278,&local_150);
        (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x1b0))
                  (this,&local_270,(ulong)local_288 & 0xffffffff,&local_1c0);
        stack0xfffffffffffffd70 = stack0xfffffffffffffd70 + ABS(local_278) * local_2a0;
        local_298._0_8_ =
             (double)local_298._0_8_ +
             *local_1c0.super_TPZVec<double>.fStore * local_2a0 * ABS(local_278);
        iVar1 = iVar1 + 1;
      }
      dVar8 = local_298._8_8_;
      local_270._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      if (local_270.fStore != (double *)0x0) {
        local_288 = dVar8;
        dStack_280 = dVar8;
        operator_delete__(local_270.fStore);
        dVar8 = local_288;
      }
      local_298._0_8_ = (double)CONCAT44(local_298._4_4_,local_298._0_4_) / dVar8;
      TPZFMatrix<double>::~TPZFMatrix(&local_150);
      TPZFMatrix<double>::~TPZFMatrix(&local_c0);
      TPZFMatrix<double>::~TPZFMatrix(&local_250);
      TPZManVector<double,_10>::~TPZManVector(&local_1c0);
      goto LAB_011801c0;
    }
    pcVar4 = "Exiting MeanSolution: is not implemented to nvars != 1.";
    lVar6 = 0x37;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  local_298._0_4_ = 0;
  local_298._4_4_ = 0;
LAB_011801c0:
  return (REAL)CONCAT44(local_298._4_4_,local_298._0_4_);
}

Assistant:

REAL TPZInterpolatedElement::MeanSolution(int var) {
    int dim = Dimension(), nvars;
    TPZMaterial * material = Material();
    if (!material) {
        cout << __PRETTY_FUNCTION__ << " no material " << std::endl;
        LOGPZ_ERROR(logger, "Meansolution no material");
        return 0.;
    }

    nvars = material->NSolutionVariables(var);
    if (nvars != 1) {
        LOGPZ_ERROR(logger, "Exiting MeanSolution: is not implemented to nvars != 1.");
        return 0.;
    }
    TPZManVector<STATE> sol(nvars, 0.);

    int i;
    TPZFMatrix<REAL> axes(3, 3, 0.);
    TPZFMatrix<REAL> jacobian(dim, dim);
    TPZFMatrix<REAL> jacinv(dim, dim);
    REAL detjac;
    TPZVec<REAL> intpoint(dim, 0.);
    REAL weight = 0.;
    REAL meanvalue = 0.;
    REAL area = 0.;
    TPZGeoEl *ref = Reference();

    for (i = 0; i < GetIntegrationRule().NPoints(); i++) {
        GetIntegrationRule().Point(i, intpoint, weight);
        ref->Jacobian(intpoint, jacobian, axes, detjac, jacinv);

        /** Compute the solution value at point integration*/
        Solution(intpoint, var, sol);
        area += weight * fabs(detjac);
#ifdef STATE_COMPLEX
        meanvalue += (weight * fabs(detjac)) * sol[0].real(); //  meanvalue += (weight*fabs(detjac)*sol[j]);
#else
        meanvalue += (weight * fabs(detjac)) * sol[0];
#endif
    }
    return (meanvalue / area);
}